

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O0

void __thiscall xmrig::Miner::Miner(Miner *this,Controller *controller)

{
  _func_int **pp_Var1;
  vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *pvVar2;
  Controller *controller_00;
  Base *in_RSI;
  ITimerListener *in_RDI;
  Controller *in_stack_ffffffffffffff68;
  MinerPrivate *in_stack_ffffffffffffff70;
  Controller *in_stack_ffffffffffffff88;
  OclBackend *this_00;
  size_type in_stack_ffffffffffffff98;
  
  ITimerListener::ITimerListener(in_RDI);
  IBaseListener::IBaseListener((IBaseListener *)(in_RDI + 1));
  IApiListener::IApiListener((IApiListener *)(in_RDI + 2));
  in_RDI->_vptr_ITimerListener = (_func_int **)&PTR__Miner_002b86f8;
  in_RDI[1]._vptr_ITimerListener = (_func_int **)&PTR__Miner_002b8730;
  in_RDI[2]._vptr_ITimerListener = (_func_int **)&PTR__Miner_002b8758;
  pp_Var1 = (_func_int **)operator_new(0x158);
  MinerPrivate::MinerPrivate(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  in_RDI[3]._vptr_ITimerListener = pp_Var1;
  Base::addListener((Base *)in_stack_ffffffffffffff70,(IBaseListener *)in_stack_ffffffffffffff68);
  Base::api(in_RSI);
  Api::addListener((Api *)in_stack_ffffffffffffff70,(IApiListener *)in_stack_ffffffffffffff68);
  pvVar2 = (vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *)operator_new(0x10);
  Timer::Timer((Timer *)in_stack_ffffffffffffff70,(ITimerListener *)in_stack_ffffffffffffff68);
  in_RDI[3]._vptr_ITimerListener[0x29] = (_func_int *)pvVar2;
  std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::reserve
            (pvVar2,in_stack_ffffffffffffff98);
  this_00 = (OclBackend *)(in_RDI[3]._vptr_ITimerListener + 0x24);
  operator_new(0x10);
  CpuBackend::CpuBackend((CpuBackend *)this_00,in_stack_ffffffffffffff88);
  std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::push_back
            ((vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *)
             in_stack_ffffffffffffff70,(value_type *)in_stack_ffffffffffffff68);
  controller_00 = (Controller *)operator_new(0x10);
  OclBackend::OclBackend(this_00,controller_00);
  std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::push_back
            ((vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *)
             in_stack_ffffffffffffff70,(value_type *)in_stack_ffffffffffffff68);
  pvVar2 = (vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *)
           (in_RDI[3]._vptr_ITimerListener + 0x24);
  operator_new(0x10);
  CudaBackend::CudaBackend((CudaBackend *)this_00,controller_00);
  std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::push_back
            (pvVar2,(value_type *)in_stack_ffffffffffffff68);
  return;
}

Assistant:

xmrig::Miner::Miner(Controller *controller)
    : d_ptr(new MinerPrivate(controller))
{
    controller->addListener(this);

#   ifdef XMRIG_FEATURE_API
    controller->api()->addListener(this);
#   endif

    d_ptr->timer = new Timer(this);

    d_ptr->backends.reserve(3);
    d_ptr->backends.push_back(new CpuBackend(controller));

#   ifdef XMRIG_FEATURE_OPENCL
    d_ptr->backends.push_back(new OclBackend(controller));
#   endif

#   ifdef XMRIG_FEATURE_CUDA
    d_ptr->backends.push_back(new CudaBackend(controller));
#   endif
}